

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::~IfcGeometricRepresentationContext
          (IfcGeometricRepresentationContext *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  LazyObject *pLVar1;
  undefined1 *puVar2;
  bool *pbVar3;
  
  *(undefined ***)&this[-1].super_IfcRepresentationContext.field_0x60 =
       &PTR__IfcGeometricRepresentationContext_0085e280;
  (this->super_IfcRepresentationContext).ContextType.ptr.field_2._M_allocated_capacity =
       (size_type)&PTR__IfcGeometricRepresentationContext_0085e2d0;
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcGeometricRepresentationContext_0085e2a8;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->super_IfcRepresentationContext).field_0x30;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  *(undefined8 *)&this[-1].super_IfcRepresentationContext.field_0x60 = 0x85e2f8;
  (this->super_IfcRepresentationContext).ContextType.ptr.field_2._M_allocated_capacity = 0x85e320;
  pLVar1 = this[-1].TrueNorth.ptr.obj;
  if (pLVar1 != (LazyObject *)&this[-1].field_0xa8) {
    operator_delete(pLVar1,*(long *)&this[-1].field_0xa8 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcRepresentationContext.field_0x70;
  pbVar3 = &this[-1].Precision.have;
  if ((bool *)puVar2 != pbVar3) {
    operator_delete(puVar2,*(long *)pbVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcRepresentationContext.field_0x60,0xc0);
  return;
}

Assistant:

IfcGeometricRepresentationContext() : Object("IfcGeometricRepresentationContext") {}